

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

int r4k_map_address_mips
              (CPUMIPSState *env,hwaddr *physical,int *prot,target_ulong_conflict address,int rw,
              int access_type)

{
  ushort uVar1;
  uint uVar2;
  CPUMIPSTLBContext *pCVar3;
  bool bVar4;
  ulong uVar5;
  uint uVar6;
  undefined1 *puVar7;
  uint uVar8;
  int unaff_R15D;
  uint uVar9;
  
  uVar2 = env->CP0_Config5;
  if ((uVar2 >> 0x11 & 1) == 0) {
    uVar6 = (uint)(ushort)((ushort)env->CP0_EntryHi_ASID_mask & (ushort)env->CP0_EntryHi);
  }
  else {
    uVar6 = env->CP0_MemoryMapID;
  }
  pCVar3 = env->tlb;
  if (pCVar3->tlb_in_use != 0) {
    puVar7 = (undefined1 *)((long)&pCVar3->mmu + 0x18);
    uVar5 = 0;
    do {
      if ((uVar2 >> 0x11 & 1) == 0) {
        uVar9 = (uint)*(ushort *)(puVar7 + -0x10);
      }
      else {
        uVar9 = *(uint *)(puVar7 + -0xc);
      }
      uVar8 = *(uint *)(puVar7 + -0x14) | 0x1fff;
      uVar1 = *(ushort *)(puVar7 + -8);
      bVar4 = true;
      if ((((uVar1 & 1) != 0) || (uVar9 == uVar6)) &&
         (-1 < (short)uVar1 && ((*(uint *)(puVar7 + -0x18) ^ address) & ~uVar8) == 0)) {
        uVar9 = ~(uVar8 >> 1) & address;
        if ((uVar9 & uVar8) == 0) {
          if ((char)uVar1 < '\0') goto LAB_00755115;
LAB_00755105:
          unaff_R15D = -3;
        }
        else {
          if ((uVar1 >> 8 & 1) == 0) goto LAB_00755105;
LAB_00755115:
          if (rw == 0) {
            if ((uVar9 & uVar8) == 0) {
              if ((uVar1 >> 0xd & 1) != 0) goto LAB_00755202;
            }
            else if (0x3fff < uVar1) {
LAB_00755202:
              unaff_R15D = -5;
              goto LAB_0075521b;
            }
LAB_00755182:
            *physical = (ulong)(uVar8 >> 1 & address) |
                        *(ulong *)(puVar7 + (ulong)((uVar9 & uVar8) != 0) * 8);
            *prot = 1;
            if ((uVar9 & uVar8) == 0) {
              uVar1 = *(ushort *)(puVar7 + -8) >> 9;
            }
            else {
              uVar1 = *(ushort *)(puVar7 + -8) >> 10;
            }
            if ((uVar1 & 1) != 0) {
              *prot = 3;
            }
            if ((uVar9 & uVar8) == 0) {
              uVar1 = *(ushort *)(puVar7 + -8) >> 0xb;
            }
            else {
              uVar1 = *(ushort *)(puVar7 + -8) >> 0xc;
            }
            unaff_R15D = 0;
            bVar4 = false;
            if ((uVar1 & 1) != 0) goto LAB_0075521e;
            *(byte *)prot = (byte)*prot | 4;
            unaff_R15D = 0;
          }
          else {
            if (rw != 1) {
              if (rw == 2) {
                if ((uVar9 & uVar8) == 0) {
                  uVar1 = uVar1 >> 0xb;
                }
                else {
                  uVar1 = uVar1 >> 0xc;
                }
                if ((uVar1 & 1) != 0) {
                  unaff_R15D = -6;
                  goto LAB_0075521b;
                }
              }
              goto LAB_00755182;
            }
            if ((uVar9 & uVar8) == 0) {
              uVar1 = uVar1 >> 9;
            }
            else {
              uVar1 = uVar1 >> 10;
            }
            if ((uVar1 & 1) != 0) goto LAB_00755182;
            unaff_R15D = -4;
          }
        }
LAB_0075521b:
        bVar4 = false;
      }
LAB_0075521e:
      if (!bVar4) {
        return unaff_R15D;
      }
      uVar5 = uVar5 + 1;
      puVar7 = puVar7 + 0x28;
    } while (uVar5 < pCVar3->tlb_in_use);
  }
  return -2;
}

Assistant:

int r4k_map_address(CPUMIPSState *env, hwaddr *physical, int *prot,
                    target_ulong address, int rw, int access_type)
{
    uint16_t ASID = env->CP0_EntryHi & env->CP0_EntryHi_ASID_mask;
    uint32_t MMID = env->CP0_MemoryMapID;
    bool mi = !!((env->CP0_Config5 >> CP0C5_MI) & 1);
    uint32_t tlb_mmid;
    int i;

    MMID = mi ? MMID : (uint32_t) ASID;

    for (i = 0; i < env->tlb->tlb_in_use; i++) {
        r4k_tlb_t *tlb = &env->tlb->mmu.r4k.tlb[i];
        /* 1k pages are not supported. */
        target_ulong mask = tlb->PageMask | ~(TARGET_PAGE_MASK << 1);
        target_ulong tag = address & ~mask;
        target_ulong VPN = tlb->VPN & ~mask;
#if defined(TARGET_MIPS64)
        tag &= env->SEGMask;
#endif

        /* Check ASID/MMID, virtual page number & size */
        tlb_mmid = mi ? tlb->MMID : (uint32_t) tlb->ASID;
        if ((tlb->G == 1 || tlb_mmid == MMID) && VPN == tag && !tlb->EHINV) {
            /* TLB match */
            int n = !!(address & mask & ~(mask >> 1));
            /* Check access rights */
            if (!(n ? tlb->V1 : tlb->V0)) {
                return TLBRET_INVALID;
            }
            if (rw == MMU_INST_FETCH && (n ? tlb->XI1 : tlb->XI0)) {
                return TLBRET_XI;
            }
            if (rw == MMU_DATA_LOAD && (n ? tlb->RI1 : tlb->RI0)) {
                return TLBRET_RI;
            }
            if (rw != MMU_DATA_STORE || (n ? tlb->D1 : tlb->D0)) {
                *physical = tlb->PFN[n] | (address & (mask >> 1));
                *prot = PAGE_READ;
                if (n ? tlb->D1 : tlb->D0) {
                    *prot |= PAGE_WRITE;
                }
                if (!(n ? tlb->XI1 : tlb->XI0)) {
                    *prot |= PAGE_EXEC;
                }
                return TLBRET_MATCH;
            }
            return TLBRET_DIRTY;
        }
    }
    return TLBRET_NOMATCH;
}